

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

bool __thiscall
PDFUsedFont::IOutlineEnumerator::Curveto
          (IOutlineEnumerator *this,FT_Short x1,FT_Short y1,FT_Short x2,FT_Short y2,FT_Short x3,
          FT_Short y3)

{
  FT_Short FVar1;
  int iVar2;
  double dVar3;
  double scale;
  FT_Short x3_local;
  FT_Short y2_local;
  FT_Short x2_local;
  FT_Short y1_local;
  FT_Short x1_local;
  IOutlineEnumerator *this_local;
  
  dVar3 = this->mFontScale;
  FVar1 = FreeTypeFaceWrapper::IOutlineEnumerator::UPM(&this->super_IOutlineEnumerator);
  dVar3 = dVar3 / (double)(int)FVar1;
  iVar2 = (*(this->super_IOutlineEnumerator)._vptr_IOutlineEnumerator[8])
                    (dVar3 * (double)(int)x1 + this->mBase_x,dVar3 * (double)(int)y1 + this->mBase_y
                     ,dVar3 * (double)(int)x2 + this->mBase_x,
                     dVar3 * (double)(int)y2 + this->mBase_y,dVar3 * (double)(int)x3 + this->mBase_x
                     ,dVar3 * (double)(int)y3 + this->mBase_y);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool PDFUsedFont::IOutlineEnumerator::Curveto(FT_Short x1, FT_Short y1, FT_Short x2, FT_Short y2, FT_Short x3, FT_Short y3)
{
	double scale = mFontScale / UPM();
	return Curveto(mBase_x + scale * x1, mBase_y + scale * y1,
	               mBase_x + scale * x2, mBase_y + scale * y2,
	               mBase_x + scale * x3, mBase_y + scale * y3);
}